

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_flip.cpp
# Opt level: O0

Bytes __thiscall
Omega_h::prevent_coarsen_flip_dim<2>(Omega_h *this,Mesh *mesh,LOs *cands2edges,Bytes *cand_codes)

{
  Int high_dim;
  LO nb;
  void *extraout_RDX;
  Bytes BVar1;
  Read<signed_char> local_188;
  Read<int> local_178;
  Read<double> local_168;
  Read<signed_char> local_158;
  Read<signed_char> local_148;
  undefined1 local_131;
  Read<signed_char> local_130;
  Read<signed_char> local_120;
  undefined1 local_110 [8];
  Reals vert_normals;
  undefined1 local_f0 [8];
  Read<signed_char> verts_matter;
  Read<signed_char> local_d0;
  undefined1 local_c0 [8];
  Bytes sides_matter;
  Read<signed_char> sides_are_exposed;
  undefined1 local_90 [8];
  Read<signed_char> sides_are_adj;
  undefined1 local_78 [4];
  int side_dim;
  undefined1 local_68 [8];
  Read<signed_char> verts_are_cands;
  Read<int> local_48;
  undefined1 local_38 [8];
  Read<signed_char> edges_are_cands;
  Bytes *cand_codes_local;
  LOs *cands2edges_local;
  Mesh *mesh_local;
  Bytes *new_codes;
  
  edges_are_cands.write_.shared_alloc_.direct_ptr = cand_codes;
  Read<int>::Read(&local_48,cands2edges);
  nb = Mesh::nedges(mesh);
  mark_image((Omega_h *)local_38,&local_48,nb);
  Read<int>::~Read(&local_48);
  Read<signed_char>::Read((Read<signed_char> *)local_78,(Read<signed_char> *)local_38);
  mark_down((Omega_h *)local_68,mesh,1,0,(Read<signed_char> *)local_78);
  Read<signed_char>::~Read((Read<signed_char> *)local_78);
  sides_are_adj.write_.shared_alloc_.direct_ptr._4_4_ = 1;
  Read<signed_char>::Read
            ((Read<signed_char> *)&sides_are_exposed.write_.shared_alloc_.direct_ptr,
             (Read<signed_char> *)local_68);
  mark_up((Omega_h *)local_90,mesh,0,1,
          (Read<signed_char> *)&sides_are_exposed.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::~Read((Read<signed_char> *)&sides_are_exposed.write_.shared_alloc_.direct_ptr);
  mark_exposed_sides((Omega_h *)&sides_matter.write_.shared_alloc_.direct_ptr,mesh);
  Read<signed_char>::Read(&local_d0,(Read<signed_char> *)local_90);
  Read<signed_char>::Read
            ((Read<signed_char> *)&verts_matter.write_.shared_alloc_.direct_ptr,
             (Read<signed_char> *)&sides_matter.write_.shared_alloc_.direct_ptr);
  land_each((Omega_h *)local_c0,&local_d0,(Bytes *)&verts_matter.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::~Read((Read<signed_char> *)&verts_matter.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::~Read(&local_d0);
  high_dim = sides_are_adj.write_.shared_alloc_.direct_ptr._4_4_;
  Read<signed_char>::Read
            ((Read<signed_char> *)&vert_normals.write_.shared_alloc_.direct_ptr,
             (Read<signed_char> *)local_c0);
  mark_down((Omega_h *)local_f0,mesh,high_dim,0,
            (Read<signed_char> *)&vert_normals.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::~Read((Read<signed_char> *)&vert_normals.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::Read
            (&local_120,(Read<signed_char> *)&sides_matter.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::Read(&local_130,(Read<signed_char> *)local_f0);
  compute_flip_normals_dim<2>((Omega_h *)local_110,mesh,&local_120,&local_130,0.95);
  Read<signed_char>::~Read(&local_130);
  Read<signed_char>::~Read(&local_120);
  local_131 = 0;
  Read<signed_char>::Read(&local_148,(Read<signed_char> *)local_c0);
  Read<signed_char>::Read(&local_158,(Read<signed_char> *)local_f0);
  Read<double>::Read(&local_168,(Read<double> *)local_110);
  Read<int>::Read(&local_178,cands2edges);
  Read<signed_char>::Read(&local_188,cand_codes);
  prevent_coarsen_flip2_dim<2>
            (this,mesh,&local_148,&local_158,&local_168,&local_178,&local_188,1e-10);
  Read<signed_char>::~Read(&local_188);
  Read<int>::~Read(&local_178);
  Read<double>::~Read(&local_168);
  Read<signed_char>::~Read(&local_158);
  Read<signed_char>::~Read(&local_148);
  local_131 = 1;
  Read<double>::~Read((Read<double> *)local_110);
  Read<signed_char>::~Read((Read<signed_char> *)local_f0);
  Read<signed_char>::~Read((Read<signed_char> *)local_c0);
  Read<signed_char>::~Read((Read<signed_char> *)&sides_matter.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::~Read((Read<signed_char> *)local_90);
  Read<signed_char>::~Read((Read<signed_char> *)local_68);
  Read<signed_char>::~Read((Read<signed_char> *)local_38);
  BVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  BVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Bytes)BVar1.write_.shared_alloc_;
}

Assistant:

Bytes prevent_coarsen_flip_dim(
    Mesh* mesh, LOs cands2edges, Bytes cand_codes) {
  auto edges_are_cands = mark_image(cands2edges, mesh->nedges());
  auto verts_are_cands = mark_down(mesh, EDGE, VERT, edges_are_cands);
  auto side_dim = dim - 1;
  auto sides_are_adj = mark_up(mesh, VERT, side_dim, verts_are_cands);
  auto sides_are_exposed = mark_exposed_sides(mesh);
  auto sides_matter = land_each(sides_are_adj, sides_are_exposed);
  auto verts_matter = mark_down(mesh, side_dim, VERT, sides_matter);
  auto vert_normals =
      compute_flip_normals_dim<dim>(mesh, sides_are_exposed, verts_matter);
  auto new_codes = prevent_coarsen_flip2_dim<dim>(
      mesh, sides_matter, verts_matter, vert_normals, cands2edges, cand_codes);
  return new_codes;
}